

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeVirtualMemReserve(ze_context_handle_t hContext,void *pStart,size_t size,void **pptr)

{
  ze_pfnVirtualMemReserve_t pfnReserve;
  ze_result_t result;
  void **pptr_local;
  size_t size_local;
  void *pStart_local;
  ze_context_handle_t hContext_local;
  
  pfnReserve._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c720 != (code *)0x0) {
    pfnReserve._4_4_ = (*DAT_0011c720)(hContext,pStart,size,pptr);
  }
  return pfnReserve._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemReserve(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* pStart,                             ///< [in][optional] pointer to start of region to reserve. If nullptr then
                                                        ///< implementation will choose a start address.
        size_t size,                                    ///< [in] size in bytes to reserve; must be page aligned.
        void** pptr                                     ///< [out] pointer to virtual reservation.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReserve = context.zeDdiTable.VirtualMem.pfnReserve;
        if( nullptr != pfnReserve )
        {
            result = pfnReserve( hContext, pStart, size, pptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }